

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ms_gauden.c
# Opt level: O1

gauden_t * gauden_init(char *meanfile,char *varfile,float32 varfloor,logmath_t *lmath)

{
  uint uVar1;
  gauden_t *g;
  logmath_t *plVar2;
  float ****ppppfVar3;
  ulong uVar4;
  int32 *flen;
  int32 d;
  int32 f;
  int32 m;
  int32 *local_50;
  float32 local_48;
  int local_44;
  uint local_40;
  int local_3c;
  logmath_t *local_38;
  
  if (meanfile == (char *)0x0) {
    __assert_fail("meanfile != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
                  ,0x13d,"gauden_t *gauden_init(const char *, const char *, float32, logmath_t *)");
  }
  if (varfile == (char *)0x0) {
    __assert_fail("varfile != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
                  ,0x13e,"gauden_t *gauden_init(const char *, const char *, float32, logmath_t *)");
  }
  local_48 = varfloor;
  if ((float)varfloor <= 0.0) {
    __assert_fail("varfloor > 0.0",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
                  ,0x13f,"gauden_t *gauden_init(const char *, const char *, float32, logmath_t *)");
  }
  g = (gauden_t *)
      __ckd_calloc__(1,0x38,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
                     ,0x141);
  local_38 = lmath;
  plVar2 = logmath_retain(lmath);
  g->lmath = plVar2;
  ppppfVar3 = gauden_param_read(meanfile,&g->n_mgau,&g->n_feat,&g->n_density,&g->featlen);
  g->mean = (mfcc_t ****)ppppfVar3;
  if (ppppfVar3 != (float ****)0x0) {
    ppppfVar3 = gauden_param_read(varfile,&local_3c,(int32 *)&local_40,&local_44,&local_50);
    g->var = (mfcc_t ****)ppppfVar3;
    if (ppppfVar3 != (float ****)0x0) {
      if (local_3c == g->n_mgau) {
        uVar1 = g->n_feat;
        if ((local_40 == uVar1) && (local_44 == g->n_density)) {
          if (0 < (int)uVar1) {
            uVar4 = 0;
            do {
              if (g->featlen[uVar4] != local_50[uVar4]) {
                err_msg(ERR_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
                        ,0x158,"Feature lengths for means and variances differ\n");
                goto LAB_0014e5c0;
              }
              uVar4 = uVar4 + 1;
            } while (uVar1 != uVar4);
          }
          ckd_free(local_50);
          gauden_dist_precompute(g,local_38,local_48);
          return g;
        }
      }
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
              ,0x151,"Mixture-gaussians dimensions for means and variances differ\n");
LAB_0014e5c0:
      ckd_free(local_50);
      gauden_free(g);
    }
  }
  return (gauden_t *)0x0;
}

Assistant:

gauden_t *
gauden_init(char const *meanfile, char const *varfile, float32 varfloor, logmath_t *lmath)
{
    int32 i, m, f, d, *flen;
    gauden_t *g;

    assert(meanfile != NULL);
    assert(varfile != NULL);
    assert(varfloor > 0.0);

    g = (gauden_t *) ckd_calloc(1, sizeof(gauden_t));
    g->lmath = logmath_retain(lmath);

    g->mean = (mfcc_t ****)gauden_param_read(meanfile, &g->n_mgau, &g->n_feat, &g->n_density,
                      &g->featlen);
    if (g->mean == NULL) {
	return NULL;
    }
    g->var = (mfcc_t ****)gauden_param_read(varfile, &m, &f, &d, &flen);
    if (g->var == NULL) {
	return NULL;
    }

    /* Verify mean and variance parameter dimensions */
    if ((m != g->n_mgau) || (f != g->n_feat) || (d != g->n_density)) {
        E_ERROR
            ("Mixture-gaussians dimensions for means and variances differ\n");
        ckd_free(flen);
        gauden_free(g);
        return NULL;
    }
    for (i = 0; i < g->n_feat; i++) {
        if (g->featlen[i] != flen[i]) {
            E_ERROR("Feature lengths for means and variances differ\n");
            ckd_free(flen);
            gauden_free(g);
            return NULL;
        }
    }

    ckd_free(flen);

    gauden_dist_precompute(g, lmath, varfloor);

    return g;
}